

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_SetSafeFlash(AWeapon *weapon,player_t *player,FState *flashstate,int index)

{
  PClassActor *pPVar1;
  MetaClass *local_30;
  PClassActor *cls;
  int index_local;
  FState *flashstate_local;
  player_t *player_local;
  AWeapon *weapon_local;
  
  cls._4_4_ = index;
  if (flashstate != (FState *)0x0) {
    for (local_30 = AWeapon::GetClass(weapon);
        local_30 != (MetaClass *)AWeapon::RegistrationInfo.MyClass;
        local_30 = (MetaClass *)
                   (local_30->super_PClassInventory).super_PClassActor.super_PClass.ParentClass) {
      if (((local_30->super_PClassInventory).super_PClassActor.OwnedStates <= flashstate) &&
         (flashstate <
          (local_30->super_PClassInventory).super_PClassActor.OwnedStates +
          (local_30->super_PClassInventory).super_PClassActor.NumOwnedStates)) {
        if (flashstate + index <
            (local_30->super_PClassInventory).super_PClassActor.OwnedStates +
            (local_30->super_PClassInventory).super_PClassActor.NumOwnedStates) {
          P_SetPsprite(player,PSP_FLASH,flashstate + index,true);
          return;
        }
        P_SetPsprite(player,PSP_FLASH,flashstate,true);
        return;
      }
    }
    pPVar1 = FState::StaticFindStateOwner(flashstate + index);
    if (pPVar1 == (PClassActor *)0x0) {
      cls._4_4_ = 0;
    }
  }
  P_SetPsprite(player,PSP_FLASH,flashstate + cls._4_4_,true);
  return;
}

Assistant:

void P_SetSafeFlash(AWeapon *weapon, player_t *player, FState *flashstate, int index)
{
	if (flashstate != nullptr)
	{
		PClassActor *cls = weapon->GetClass();
		while (cls != RUNTIME_CLASS(AWeapon))
		{
			if (flashstate >= cls->OwnedStates && flashstate < cls->OwnedStates + cls->NumOwnedStates)
			{
				// The flash state belongs to this class.
				// Now let's check if the actually wanted state does also
				if (flashstate + index < cls->OwnedStates + cls->NumOwnedStates)
				{
					// we're ok so set the state
					P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
					return;
				}
				else
				{
					// oh, no! The state is beyond the end of the state table so use the original flash state.
					P_SetPsprite(player, PSP_FLASH, flashstate, true);
					return;
				}
			}
			// try again with parent class
			cls = static_cast<PClassActor *>(cls->ParentClass);
		}
		// if we get here the state doesn't seem to belong to any class in the inheritance chain
		// This can happen with Dehacked if the flash states are remapped. 
		// The only way to check this would be to go through all Dehacked modifiable actors, convert
		// their states into a single flat array and find the correct one.
		// Rather than that, just check to make sure it belongs to something.
		if (FState::StaticFindStateOwner(flashstate + index) == NULL)
		{ // Invalid state. With no index offset, it should at least be valid.
			index = 0;
		}
	}
	P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
}